

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O0

RK_S32 vp9_parser_frame(Vp9CodecContext *ctx,HalDecTask *task)

{
  RK_U8 *pRVar1;
  RK_U32 RVar2;
  size_t sVar3;
  RK_S64 RVar4;
  RK_U8 (*paRVar5) [3];
  RK_U8 (*paRVar6) [3];
  MppFrame local_68;
  MppFrame mframe;
  RK_S32 m;
  RK_S32 l;
  RK_S32 k;
  RK_S32 j;
  MppFrame frame;
  TxfmMode local_40;
  RK_S32 ref;
  RK_S32 i;
  RK_S32 res;
  VP9Context *s;
  RK_U8 *pRStack_28;
  RK_S32 size;
  RK_U8 *data;
  HalDecTask *task_local;
  Vp9CodecContext *ctx_local;
  
  pRStack_28 = (RK_U8 *)0x0;
  s._4_4_ = 0;
  _i = (VP9Context *)ctx->priv_data;
  frame._4_4_ = 0;
  data = (RK_U8 *)task;
  task_local = (HalDecTask *)ctx;
  if ((vp9d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"%s",(char *)0x0,"vp9_parser_frame");
  }
  data[0] = 0xff;
  data[1] = 0xff;
  data[2] = 0xff;
  data[3] = 0xff;
  pRStack_28 = (RK_U8 *)mpp_packet_get_pos(*(MppPacket *)&task_local->reg_index);
  sVar3 = mpp_packet_get_length(*(MppPacket *)&task_local->reg_index);
  s._4_4_ = (uint)sVar3;
  RVar4 = mpp_packet_get_pts(*(MppPacket *)&task_local->reg_index);
  _i->pts = RVar4;
  if ((vp9d_debug & 2) != 0) {
    _mpp_log_l(4,(char *)0x0,"data size %d",(char *)0x0,(ulong)s._4_4_);
  }
  if ((int)s._4_4_ < 1) {
    ctx_local._4_4_ = 0;
  }
  else {
    ref = decode_parser_header
                    ((Vp9CodecContext *)task_local,pRStack_28,s._4_4_,(RK_S32 *)((long)&frame + 4));
    ctx_local._4_4_ = ref;
    if (-1 < ref) {
      if (ref == 0) {
        if (_i->refs[frame._4_4_].ref == (RefInfo *)0x0) {
          ctx_local._4_4_ = 0xffffffff;
        }
        else {
          _k = (MppFrame)0x0;
          mpp_buf_slot_get_prop(_i->slots,_i->refs[frame._4_4_].slot_index,SLOT_FRAME_PTR,&k);
          mpp_frame_set_pts(_k,_i->pts);
          mpp_buf_slot_set_flag(_i->slots,_i->refs[frame._4_4_].slot_index,SLOT_QUEUE_USE);
          mpp_buf_slot_enqueue(_i->slots,_i->refs[frame._4_4_].slot_index,QUEUE_DISPLAY);
          (_i->refs[frame._4_4_].ref)->is_output = 1;
          _i->outframe_num = _i->outframe_num + 1;
          _mpp_log_l(4,(char *)0x0,"out repeat num %d",(char *)0x0);
          ctx_local._4_4_ = s._4_4_;
        }
      }
      else {
        pRStack_28 = pRStack_28 + ref;
        s._4_4_ = s._4_4_ - ref;
        if (_i->frames[1].ref != (RefInfo *)0x0) {
          vp9_unref_frame(_i,_i->frames + 1);
        }
        if ((((_i->intraonly != '\0') || (_i->keyframe != '\0')) || (_i->errorres != '\0')) ||
           ((_i->frames[0].ref == (RefInfo *)0x0 ||
            (ref = vp9_ref_frame((Vp9CodecContext *)task_local,_i->frames + 1,_i->frames),
            ctx_local._4_4_ = ref, -1 < ref)))) {
          if (_i->frames[0].ref != (RefInfo *)0x0) {
            vp9_unref_frame(_i,_i->frames);
          }
          ref = vp9_alloc_frame((Vp9CodecContext *)task_local,_i->frames);
          ctx_local._4_4_ = ref;
          if (-1 < ref) {
            if ((_i->refreshctx != '\0') && (_i->parallelmode != '\0')) {
              for (local_40 = ONLY_4X4; (int)local_40 < 4; local_40 = local_40 + TX_8X8) {
                for (l = 0; l < 2; l = l + 1) {
                  for (m = 0; m < 2; m = m + 1) {
                    for (mframe._4_4_ = 0; mframe._4_4_ < 6; mframe._4_4_ = mframe._4_4_ + 1) {
                      for (mframe._0_4_ = 0; (int)mframe < 6; mframe._0_4_ = (int)mframe + 1) {
                        paRVar5 = _i->prob_ctx[_i->framectxid].coef[(int)local_40][l][m]
                                  [mframe._4_4_] + (int)mframe;
                        paRVar6 = (_i->prob).coef[(int)local_40][l][m][mframe._4_4_] + (int)mframe;
                        *(undefined2 *)*paRVar5 = *(undefined2 *)*paRVar6;
                        *(RK_U8 *)((long)*paRVar5 + 2) = *(RK_U8 *)((long)*paRVar6 + 2);
                      }
                    }
                  }
                }
                if (_i->txfmmode == local_40) break;
              }
              memcpy(_i->prob_ctx + _i->framectxid,&_i->prob,0x137);
            }
            vp9d_parser2_syntax((Vp9CodecContext *)task_local);
            *(RK_S32 **)(data + 0x18) = task_local->refer;
            data[0x10] = '\x01';
            data[0x11] = '\0';
            data[0x12] = '\0';
            data[0x13] = '\0';
            data[0] = '\x01';
            data[1] = '\0';
            data[2] = '\0';
            data[3] = '\0';
            *(RK_S32 *)(data + 0x34) = _i->frames[0].slot_index;
            *(undefined8 *)(data + 0x20) = *(undefined8 *)&task_local->reg_index;
            for (local_40 = 0; (int)local_40 < 3; local_40 = local_40 + 1) {
              if (_i->refs[_i->refidx[(int)local_40]].slot_index < 0x7f) {
                local_68 = (MppFrame)0x0;
                mpp_buf_slot_set_flag
                          (_i->slots,_i->refs[_i->refidx[(int)local_40]].slot_index,SLOT_HAL_INPUT);
                *(RK_S32 *)(data + (long)(int)local_40 * 4 + 0x38) =
                     _i->refs[_i->refidx[(int)local_40]].slot_index;
                mpp_buf_slot_get_prop
                          (_i->slots,*(RK_S32 *)(data + (long)(int)local_40 * 4 + 0x38),
                           SLOT_FRAME_PTR,&local_68);
                if (((local_68 != (MppFrame)0x0) && (_i->keyframe == '\0')) &&
                   (_i->intraonly == '\0')) {
                  RVar2 = mpp_frame_get_errinfo(local_68);
                  *(ulong *)(data + 8) =
                       *(ulong *)(data + 8) & 0xfffffffffffffff7 |
                       ((ulong)((uint)(*(ulong *)(data + 8) >> 3) & 1 | RVar2) & 1) << 3;
                }
              }
              else {
                pRVar1 = data + (long)(int)local_40 * 4 + 0x38;
                pRVar1[0] = 0xff;
                pRVar1[1] = 0xff;
                pRVar1[2] = 0xff;
                pRVar1[3] = 0xff;
              }
            }
            if ((vp9d_debug & 4) != 0) {
              _mpp_log_l(4,(char *)0x0,"ref_errinfo=%d\n",(char *)0x0,*(ulong *)(data + 8) >> 3 & 1)
              ;
            }
            if (_i->eos != 0) {
              *(ulong *)(data + 8) = *(ulong *)(data + 8) & 0xfffffffffffffffe | 1;
            }
            if (_i->invisible == '\0') {
              mpp_buf_slot_set_flag(_i->slots,_i->frames[0].slot_index,SLOT_QUEUE_USE);
              mpp_buf_slot_enqueue(_i->slots,_i->frames[0].slot_index,QUEUE_DISPLAY);
            }
            if ((vp9d_debug & 4) != 0) {
              _mpp_log_l(4,(char *)0x0,"s->refreshrefmask = %d s->frames[CUR_FRAME] = %d",
                         (char *)0x0,(ulong)_i->refreshrefmask,(ulong)(uint)_i->frames[0].slot_index
                        );
            }
            for (local_40 = 0; (int)local_40 < 3; local_40 = local_40 + 1) {
              if ((_i->refs[_i->refidx[(int)local_40]].ref != (RefInfo *)0x0) &&
                 ((vp9d_debug & 4) != 0)) {
                _mpp_log_l(4,(char *)0x0,"ref buf select %d",(char *)0x0,
                           (ulong)(uint)_i->refs[_i->refidx[(int)local_40]].slot_index);
              }
            }
            for (local_40 = 0; (int)local_40 < 8; local_40 = local_40 + 1) {
              if ((vp9d_debug & 4) != 0) {
                _mpp_log_l(4,(char *)0x0,"s->refreshrefmask = 0x%x",(char *)0x0,
                           (ulong)_i->refreshrefmask);
              }
              ref = 0;
              if (((uint)_i->refreshrefmask & 1 << ((byte)local_40 & 0x1f)) != 0) {
                if (_i->refs[(int)local_40].ref != (RefInfo *)0x0) {
                  vp9_unref_frame(_i,_i->refs + (int)local_40);
                }
                if ((vp9d_debug & 4) != 0) {
                  _mpp_log_l(4,(char *)0x0,"update ref index in %d",(char *)0x0,(ulong)local_40);
                }
                ref = vp9_ref_frame((Vp9CodecContext *)task_local,_i->refs + (int)local_40,
                                    _i->frames);
              }
              if ((_i->refs[(int)local_40].ref != (RefInfo *)0x0) && ((vp9d_debug & 4) != 0)) {
                _mpp_log_l(4,(char *)0x0,"s->refs[%d] = %d",(char *)0x0,(ulong)local_40,
                           (ulong)(uint)_i->refs[(int)local_40].slot_index);
              }
              if (ref < 0) {
                return 0;
              }
            }
            ctx_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

RK_S32 vp9_parser_frame(Vp9CodecContext *ctx, HalDecTask *task)
{

    const RK_U8 *data = NULL;
    RK_S32 size = 0;
    VP9Context *s = (VP9Context *)ctx->priv_data;
    RK_S32 res, i, ref = 0;

    vp9d_dbg(VP9D_DBG_FUNCTION, "%s", __FUNCTION__);
    task->valid = -1;
#ifdef dump
    dec_num++;
#endif
    data = (const RK_U8 *)mpp_packet_get_pos(ctx->pkt);
    size = (RK_S32)mpp_packet_get_length(ctx->pkt);

    s->pts = mpp_packet_get_pts(ctx->pkt);

    vp9d_dbg(VP9D_DBG_HEADER, "data size %d", size);
    if (size <= 0) {
        return MPP_OK;
    }
    if ((res = decode_parser_header(ctx, data, size, &ref)) < 0) {
        return res;
    } else if (res == 0) {
        if (!s->refs[ref].ref) {
            //mpp_err("Requested reference %d not available\n", ref);
            return -1;//AVERROR_INVALIDDATA;
        }
        {
            MppFrame frame = NULL;

            mpp_buf_slot_get_prop(s->slots, s->refs[ref].slot_index, SLOT_FRAME_PTR, &frame);
            mpp_frame_set_pts(frame, s->pts);
            mpp_buf_slot_set_flag(s->slots, s->refs[ref].slot_index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(s->slots, s->refs[ref].slot_index, QUEUE_DISPLAY);
            s->refs[ref].ref->is_output = 1;
        }

        mpp_log("out repeat num %d", s->outframe_num++);
        return size;
    }
    data += res;
    size -= res;

    if (s->frames[REF_FRAME_MVPAIR].ref)
        vp9_unref_frame(s, &s->frames[REF_FRAME_MVPAIR]);

    if (!s->intraonly && !s->keyframe && !s->errorres && s->frames[CUR_FRAME].ref) {
        if ((res = vp9_ref_frame(ctx, &s->frames[REF_FRAME_MVPAIR], &s->frames[CUR_FRAME])) < 0)
            return res;
    }

    if (s->frames[CUR_FRAME].ref)
        vp9_unref_frame(s, &s->frames[CUR_FRAME]);

    if ((res = vp9_alloc_frame(ctx, &s->frames[CUR_FRAME])) < 0)
        return res;

    if (s->refreshctx && s->parallelmode) {
        RK_S32 j, k, l, m;

        for (i = 0; i < 4; i++) {
            for (j = 0; j < 2; j++)
                for (k = 0; k < 2; k++)
                    for (l = 0; l < 6; l++)
                        for (m = 0; m < 6; m++)
                            memcpy(s->prob_ctx[s->framectxid].coef[i][j][k][l][m],
                                   s->prob.coef[i][j][k][l][m], 3);
            if ((RK_S32)s->txfmmode == i)
                break;
        }
        s->prob_ctx[s->framectxid].p = s->prob.p;
    }

    vp9d_parser2_syntax(ctx);

    task->syntax.data = (void*)&ctx->pic_params;
    task->syntax.number = 1;
    task->valid = 1;
    task->output = s->frames[CUR_FRAME].slot_index;
    task->input_packet = ctx->pkt;

    for (i = 0; i < 3; i++) {
        if (s->refs[s->refidx[i]].slot_index < 0x7f) {
            MppFrame mframe = NULL;
            mpp_buf_slot_set_flag(s->slots, s->refs[s->refidx[i]].slot_index, SLOT_HAL_INPUT);
            task->refer[i] = s->refs[s->refidx[i]].slot_index;
            mpp_buf_slot_get_prop(s->slots, task->refer[i], SLOT_FRAME_PTR, &mframe);
            if (mframe && !s->keyframe && !s->intraonly)
                task->flags.ref_err |= mpp_frame_get_errinfo(mframe);
        } else {
            task->refer[i] = -1;
        }
    }

    vp9d_dbg(VP9D_DBG_REF, "ref_errinfo=%d\n", task->flags.ref_err);
    if (s->eos) {
        task->flags.eos = 1;
    }

    if (!s->invisible) {
        mpp_buf_slot_set_flag(s->slots,  s->frames[CUR_FRAME].slot_index, SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(s->slots, s->frames[CUR_FRAME].slot_index, QUEUE_DISPLAY);
    }
    vp9d_dbg(VP9D_DBG_REF, "s->refreshrefmask = %d s->frames[CUR_FRAME] = %d",
             s->refreshrefmask, s->frames[CUR_FRAME].slot_index);
    for (i = 0; i < 3; i++) {
        if (s->refs[s->refidx[i]].ref != NULL) {
            vp9d_dbg(VP9D_DBG_REF, "ref buf select %d", s->refs[s->refidx[i]].slot_index);
        }
    }
    // ref frame setup
    for (i = 0; i < 8; i++) {
        vp9d_dbg(VP9D_DBG_REF, "s->refreshrefmask = 0x%x", s->refreshrefmask);
        res = 0;
        if (s->refreshrefmask & (1 << i)) {
            if (s->refs[i].ref)
                vp9_unref_frame(s, &s->refs[i]);
            vp9d_dbg(VP9D_DBG_REF, "update ref index in %d", i);
            res = vp9_ref_frame(ctx, &s->refs[i], &s->frames[CUR_FRAME]);
        }

        if (s->refs[i].ref)
            vp9d_dbg(VP9D_DBG_REF, "s->refs[%d] = %d", i, s->refs[i].slot_index);
        if (res < 0)
            return 0;
    }
    return 0;
}